

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

index_t __thiscall
xLearn::DMatrix::GetMiniBatch(DMatrix *this,index_t batch_size,DMatrix *mini_batch)

{
  value_type vVar1;
  value_type pvVar2;
  reference ppvVar3;
  reference pvVar4;
  long in_RDX;
  uint in_ESI;
  DMatrix *in_RDI;
  index_t i;
  uint local_24;
  
  local_24 = 0;
  while( true ) {
    if (in_ESI <= local_24) {
      return in_ESI;
    }
    if (in_RDI->row_length <= in_RDI->pos) break;
    AddRow(in_RDI);
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[](&in_RDI->row,(ulong)in_RDI->pos);
    pvVar2 = *ppvVar3;
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDX + 0x18),(ulong)local_24);
    *ppvVar3 = pvVar2;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&in_RDI->Y,(ulong)in_RDI->pos);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDX + 0x30),(ulong)local_24);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&in_RDI->norm,(ulong)in_RDI->pos);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDX + 0x48),(ulong)local_24);
    *pvVar4 = vVar1;
    in_RDI->pos = in_RDI->pos + 1;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

index_t GetMiniBatch(index_t batch_size, DMatrix& mini_batch) {
    // Copy mini-batch
    for (index_t i = 0; i < batch_size; ++i) {
      if (this->pos >= this->row_length) {
        return i;
      }
      mini_batch.AddRow();
      mini_batch.row[i] = this->row[pos];
      mini_batch.Y[i] = this->Y[pos];
      mini_batch.norm[i] = this->norm[pos];
      this->pos++;
    }
    return batch_size;
  }